

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O1

void __thiscall flatbuffers::cpp::CppGenerator::GenUnionPost(CppGenerator *this,EnumDef *enum_def)

{
  CodeWriter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  BaseType BVar2;
  EnumVal *pEVar3;
  IDLOptions *pIVar4;
  StructDef *pSVar5;
  pointer ppFVar6;
  pointer ppFVar7;
  FieldDef *pFVar8;
  bool bVar9;
  CppGenerator *pCVar10;
  EnumDef *pEVar11;
  mapped_type *pmVar12;
  long *plVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  const_iterator cVar17;
  size_type *psVar18;
  pointer ppFVar19;
  undefined8 uVar20;
  _Alloc_hider _Var21;
  pointer ppEVar22;
  bool bVar23;
  key_type local_a90;
  string local_a70;
  CppGenerator *local_a50;
  EnumDef *local_a48;
  IDLOptions *local_a40;
  IDLOptions *local_a38;
  string local_a30;
  string local_a10;
  string local_9f0;
  string local_9d0;
  string local_9b0;
  string local_990;
  string local_970;
  string local_950;
  string local_930;
  string local_910;
  string local_8f0;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  string local_7f0;
  string local_7d0;
  string local_7b0;
  string local_790;
  string local_770;
  string local_750;
  string local_730;
  string local_710;
  string local_6f0;
  string local_6d0;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  paVar16 = &local_a90.field_2;
  local_a90._M_dataplus._M_p = (pointer)paVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a90,"ENUM_NAME","");
  EscapeKeyword(&local_a70,this,(string *)enum_def);
  this_00 = &this->code_;
  pmVar12 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this_00->value_map_,&local_a90);
  std::__cxx11::string::_M_assign((string *)pmVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
    operator_delete(local_a70._M_dataplus._M_p,local_a70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a90._M_dataplus._M_p != paVar16) {
    operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
  }
  UnionVerifySignature_abi_cxx11_(&local_a70,this,enum_def);
  plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_a70,0,(char *)0x0,0x36af97);
  psVar18 = (size_type *)(plVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar18) {
    local_a90.field_2._M_allocated_capacity = *psVar18;
    local_a90.field_2._8_8_ = plVar13[3];
    local_a90._M_dataplus._M_p = (pointer)paVar16;
  }
  else {
    local_a90.field_2._M_allocated_capacity = *psVar18;
    local_a90._M_dataplus._M_p = (pointer)*plVar13;
  }
  local_a90._M_string_length = plVar13[1];
  *plVar13 = (long)psVar18;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_a90);
  psVar18 = (size_type *)(plVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar18) {
    local_8b0.field_2._M_allocated_capacity = *psVar18;
    local_8b0.field_2._8_8_ = plVar13[3];
    local_8b0._M_dataplus._M_p = (pointer)&local_8b0.field_2;
  }
  else {
    local_8b0.field_2._M_allocated_capacity = *psVar18;
    local_8b0._M_dataplus._M_p = (pointer)*plVar13;
  }
  local_8b0._M_string_length = plVar13[1];
  *plVar13 = (long)psVar18;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  CodeWriter::operator+=(this_00,&local_8b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b0._M_dataplus._M_p != &local_8b0.field_2) {
    operator_delete(local_8b0._M_dataplus._M_p,local_8b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a90._M_dataplus._M_p != paVar16) {
    operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
    operator_delete(local_a70._M_dataplus._M_p,local_a70.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"  switch (type) {","");
  CodeWriter::operator+=(this_00,&local_50);
  local_a50 = this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  ppEVar22 = (enum_def->vals).vec.
             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_a48 = enum_def;
  if (ppEVar22 !=
      (enum_def->vals).vec.
      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_a40 = &(local_a50->opts_).super_IDLOptions;
    do {
      pEVar3 = *ppEVar22;
      local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a90,"LABEL","");
      GetEnumValUse_abi_cxx11_(&local_a70,local_a50,local_a48,pEVar3);
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&this_00->value_map_,&local_a90);
      std::__cxx11::string::_M_assign((string *)pmVar12);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
        operator_delete(local_a70._M_dataplus._M_p,local_a70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
        operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
      }
      if (pEVar3->value == 0) {
        local_6f0._M_dataplus._M_p = (pointer)&local_6f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_6f0,"    case {{LABEL}}: {","");
        CodeWriter::operator+=(this_00,&local_6f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6f0._M_dataplus._M_p != &local_6f0.field_2) {
          operator_delete(local_6f0._M_dataplus._M_p,local_6f0.field_2._M_allocated_capacity + 1);
        }
        local_9f0._M_dataplus._M_p = (pointer)&local_9f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_9f0,"      return true;","");
        CodeWriter::operator+=(this_00,&local_9f0);
        paVar16 = &local_d0.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_9f0._M_dataplus._M_p != &local_9f0.field_2) {
          operator_delete(local_9f0._M_dataplus._M_p,local_9f0.field_2._M_allocated_capacity + 1);
        }
        local_d0._M_dataplus._M_p = (pointer)paVar16;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"    }","");
        CodeWriter::operator+=(this_00,&local_d0);
        _Var21._M_p = local_d0._M_dataplus._M_p;
      }
      else {
        local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a90,"TYPE","");
        GetUnionElement_abi_cxx11_(&local_a70,local_a50,pEVar3,false,local_a40);
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&this_00->value_map_,&local_a90);
        std::__cxx11::string::_M_assign((string *)pmVar12);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
          operator_delete(local_a70._M_dataplus._M_p,local_a70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
          operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
        }
        local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_690,"    case {{LABEL}}: {","");
        CodeWriter::operator+=(this_00,&local_690);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_690._M_dataplus._M_p != &local_690.field_2) {
          operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
        }
        BVar2 = (pEVar3->union_type).base_type;
        if (BVar2 == BASE_TYPE_STRING) {
          local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_6d0,
                     "      auto ptr = reinterpret_cast<const {{TYPE}} *>(obj);","");
          CodeWriter::operator+=(this_00,&local_6d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
            operator_delete(local_6d0._M_dataplus._M_p,local_6d0.field_2._M_allocated_capacity + 1);
          }
          paVar14 = &local_b0.field_2;
          local_b0._M_dataplus._M_p = (pointer)paVar14;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,"      return verifier.VerifyString(ptr);","");
          CodeWriter::operator+=(this_00,&local_b0);
          bVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_b0._M_dataplus._M_p == paVar14;
          _Var21._M_p = local_b0._M_dataplus._M_p;
        }
        else {
          if (BVar2 != BASE_TYPE_STRUCT) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                          ,0x652,
                          "void flatbuffers::cpp::CppGenerator::GenUnionPost(const EnumDef &)");
          }
          paVar14 = &local_90.field_2;
          if (((pEVar3->union_type).struct_def)->fixed == true) {
            local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_a90,"ALIGN","");
            NumToString<unsigned_long>(&local_a70,((pEVar3->union_type).struct_def)->minalign);
            paVar14 = &local_70.field_2;
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&this_00->value_map_,&local_a90);
            std::__cxx11::string::_M_assign((string *)pmVar12);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
              operator_delete(local_a70._M_dataplus._M_p,local_a70.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
              operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1
                             );
            }
            local_70._M_dataplus._M_p = (pointer)paVar14;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_70,
                       "      return verifier.VerifyField<{{TYPE}}>(static_cast<const uint8_t *>(obj), 0, {{ALIGN}});"
                       ,"");
            CodeWriter::operator+=(this_00,&local_70);
            _Var21._M_p = local_70._M_dataplus._M_p;
          }
          else {
            local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_6b0,
                       "      auto ptr = reinterpret_cast<const {{TYPE}} *>(obj);","");
            CodeWriter::operator+=(this_00,&local_6b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
              operator_delete(local_6b0._M_dataplus._M_p,local_6b0.field_2._M_allocated_capacity + 1
                             );
            }
            local_90._M_dataplus._M_p = (pointer)paVar14;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_90,"      return verifier.VerifyTable(ptr);","");
            CodeWriter::operator+=(this_00,&local_90);
            _Var21._M_p = local_90._M_dataplus._M_p;
          }
          bVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)_Var21._M_p == paVar14;
        }
        paVar16 = &local_8d0.field_2;
        if (!bVar23) {
          operator_delete(_Var21._M_p,paVar14->_M_allocated_capacity + 1);
        }
        local_8d0._M_dataplus._M_p = (pointer)paVar16;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"    }","");
        CodeWriter::operator+=(this_00,&local_8d0);
        _Var21._M_p = local_8d0._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var21._M_p != paVar16) {
        operator_delete(_Var21._M_p,paVar16->_M_allocated_capacity + 1);
      }
      ppEVar22 = ppEVar22 + 1;
    } while (ppEVar22 !=
             (local_a48->vals).vec.
             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,"    default: return true;","");
  CodeWriter::operator+=(this_00,&local_f0);
  pEVar11 = local_a48;
  pCVar10 = local_a50;
  paVar16 = &local_a90.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"  }","");
  CodeWriter::operator+=(this_00,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"}","");
  CodeWriter::operator+=(this_00,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"");
  CodeWriter::operator+=(this_00,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  UnionVectorVerifySignature_abi_cxx11_(&local_a70,pCVar10,pEVar11);
  plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_a70,0,(char *)0x0,0x36af97);
  psVar18 = (size_type *)(plVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar18) {
    local_a90.field_2._M_allocated_capacity = *psVar18;
    local_a90.field_2._8_8_ = plVar13[3];
    local_a90._M_dataplus._M_p = (pointer)paVar16;
  }
  else {
    local_a90.field_2._M_allocated_capacity = *psVar18;
    local_a90._M_dataplus._M_p = (pointer)*plVar13;
  }
  local_a90._M_string_length = plVar13[1];
  *plVar13 = (long)psVar18;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_a90);
  psVar18 = (size_type *)(plVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar18) {
    local_8f0.field_2._M_allocated_capacity = *psVar18;
    local_8f0.field_2._8_8_ = plVar13[3];
    local_8f0._M_dataplus._M_p = (pointer)&local_8f0.field_2;
  }
  else {
    local_8f0.field_2._M_allocated_capacity = *psVar18;
    local_8f0._M_dataplus._M_p = (pointer)*plVar13;
  }
  local_8f0._M_string_length = plVar13[1];
  *plVar13 = (long)psVar18;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  CodeWriter::operator+=(this_00,&local_8f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
    operator_delete(local_8f0._M_dataplus._M_p,local_8f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a90._M_dataplus._M_p != paVar16) {
    operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
    operator_delete(local_a70._M_dataplus._M_p,local_a70.field_2._M_allocated_capacity + 1);
  }
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_170,"  if (!values || !types) return !values && !types;","");
  CodeWriter::operator+=(this_00,&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_190,"  if (values->size() != types->size()) return false;","");
  CodeWriter::operator+=(this_00,&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b0,
             "  for (::flatbuffers::uoffset_t i = 0; i < values->size(); ++i) {","");
  CodeWriter::operator+=(this_00,&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  EscapeKeyword(&local_a70,pCVar10,(string *)pEVar11);
  plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_a70,0,(char *)0x0,0x36bd6a);
  psVar18 = (size_type *)(plVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar18) {
    local_a90.field_2._M_allocated_capacity = *psVar18;
    local_a90.field_2._8_8_ = plVar13[3];
    local_a90._M_dataplus._M_p = (pointer)paVar16;
  }
  else {
    local_a90.field_2._M_allocated_capacity = *psVar18;
    local_a90._M_dataplus._M_p = (pointer)*plVar13;
  }
  local_a90._M_string_length = plVar13[1];
  *plVar13 = (long)psVar18;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_a90);
  psVar18 = (size_type *)(plVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar18) {
    local_910.field_2._M_allocated_capacity = *psVar18;
    local_910.field_2._8_8_ = plVar13[3];
    local_910._M_dataplus._M_p = (pointer)&local_910.field_2;
  }
  else {
    local_910.field_2._M_allocated_capacity = *psVar18;
    local_910._M_dataplus._M_p = (pointer)*plVar13;
  }
  local_910._M_string_length = plVar13[1];
  *plVar13 = (long)psVar18;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  CodeWriter::operator+=(this_00,&local_910);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_910._M_dataplus._M_p != &local_910.field_2) {
    operator_delete(local_910._M_dataplus._M_p,local_910.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a90._M_dataplus._M_p != paVar16) {
    operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
    operator_delete(local_a70._M_dataplus._M_p,local_a70.field_2._M_allocated_capacity + 1);
  }
  EscapeKeyword(&local_a70,pCVar10,(string *)pEVar11);
  plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_a70,0,(char *)0x0,0x36bd7a);
  psVar18 = (size_type *)(plVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar18) {
    local_a90.field_2._M_allocated_capacity = *psVar18;
    local_a90.field_2._8_8_ = plVar13[3];
    local_a90._M_dataplus._M_p = (pointer)paVar16;
  }
  else {
    local_a90.field_2._M_allocated_capacity = *psVar18;
    local_a90._M_dataplus._M_p = (pointer)*plVar13;
  }
  local_a90._M_string_length = plVar13[1];
  *plVar13 = (long)psVar18;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  plVar13 = (long *)std::__cxx11::string::append((char *)&local_a90);
  psVar18 = (size_type *)(plVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar18) {
    local_930.field_2._M_allocated_capacity = *psVar18;
    local_930.field_2._8_8_ = plVar13[3];
    local_930._M_dataplus._M_p = (pointer)&local_930.field_2;
  }
  else {
    local_930.field_2._M_allocated_capacity = *psVar18;
    local_930._M_dataplus._M_p = (pointer)*plVar13;
  }
  local_930._M_string_length = plVar13[1];
  *plVar13 = (long)psVar18;
  plVar13[1] = 0;
  *(undefined1 *)(plVar13 + 2) = 0;
  CodeWriter::operator+=(this_00,&local_930);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_930._M_dataplus._M_p != &local_930.field_2) {
    operator_delete(local_930._M_dataplus._M_p,local_930.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a90._M_dataplus._M_p != paVar16) {
    operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
    operator_delete(local_a70._M_dataplus._M_p,local_a70.field_2._M_allocated_capacity + 1);
  }
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"      return false;","");
  CodeWriter::operator+=(this_00,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"    }","");
  CodeWriter::operator+=(this_00,&local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"  }","");
  CodeWriter::operator+=(this_00,&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"  return true;","");
  CodeWriter::operator+=(this_00,&local_230);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"}","");
  CodeWriter::operator+=(this_00,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"");
  CodeWriter::operator+=(this_00,&local_270);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((pCVar10->opts_).super_IDLOptions.generate_object_based_api == true) {
    UnionUnPackSignature_abi_cxx11_(&local_a70,pCVar10,pEVar11,false);
    plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_a70,0,(char *)0x0,0x36af97);
    psVar18 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_a90.field_2._M_allocated_capacity = *psVar18;
      local_a90.field_2._8_8_ = plVar13[3];
      local_a90._M_dataplus._M_p = (pointer)paVar16;
    }
    else {
      local_a90.field_2._M_allocated_capacity = *psVar18;
      local_a90._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_a90._M_string_length = plVar13[1];
    *plVar13 = (long)psVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_a90);
    psVar18 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_950.field_2._M_allocated_capacity = *psVar18;
      local_950.field_2._8_8_ = plVar13[3];
      local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
    }
    else {
      local_950.field_2._M_allocated_capacity = *psVar18;
      local_950._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_950._M_string_length = plVar13[1];
    *plVar13 = (long)psVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    CodeWriter::operator+=(this_00,&local_950);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_950._M_dataplus._M_p != &local_950.field_2) {
      operator_delete(local_950._M_dataplus._M_p,local_950.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a90._M_dataplus._M_p != paVar16) {
      operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
      operator_delete(local_a70._M_dataplus._M_p,local_a70.field_2._M_allocated_capacity + 1);
    }
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"  (void)resolver;","");
    CodeWriter::operator+=(this_00,&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"  switch (type) {","");
    CodeWriter::operator+=(this_00,&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    local_a38 = &(pCVar10->opts_).super_IDLOptions;
    ppEVar22 = (pEVar11->vals).vec.
               super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppEVar22 !=
        (pEVar11->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        pIVar4 = (IDLOptions *)*ppEVar22;
        if ((pIVar4->object_prefix).field_2._M_allocated_capacity != 0) {
          local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a90,"LABEL","");
          GetEnumValUse_abi_cxx11_(&local_a70,local_a50,local_a48,(EnumVal *)pIVar4);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&this_00->value_map_,&local_a90);
          std::__cxx11::string::_M_assign((string *)pmVar12);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
            operator_delete(local_a70._M_dataplus._M_p,local_a70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
            operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
          }
          local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a90,"TYPE","");
          GetUnionElement_abi_cxx11_(&local_a70,local_a50,(EnumVal *)pIVar4,false,local_a38);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&this_00->value_map_,&local_a90);
          std::__cxx11::string::_M_assign((string *)pmVar12);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
            operator_delete(local_a70._M_dataplus._M_p,local_a70.field_2._M_allocated_capacity + 1);
          }
          local_a40 = pIVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
            operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
          }
          local_9d0._M_dataplus._M_p = (pointer)&local_9d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_9d0,"    case {{LABEL}}: {","");
          CodeWriter::operator+=(this_00,&local_9d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9d0._M_dataplus._M_p != &local_9d0.field_2) {
            operator_delete(local_9d0._M_dataplus._M_p,local_9d0.field_2._M_allocated_capacity + 1);
          }
          local_710._M_dataplus._M_p = (pointer)&local_710.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_710,
                     "      auto ptr = reinterpret_cast<const {{TYPE}} *>(obj);","");
          CodeWriter::operator+=(this_00,&local_710);
          pIVar4 = local_a40;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_710._M_dataplus._M_p != &local_710.field_2) {
            operator_delete(local_710._M_dataplus._M_p,local_710.field_2._M_allocated_capacity + 1);
          }
          BVar2 = ((Type *)&pIVar4->cpp_object_api_string_type)->base_type;
          if (BVar2 == BASE_TYPE_STRING) {
            local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_750,
                       "      return new std::string(ptr->c_str(), ptr->size());","");
            CodeWriter::operator+=(this_00,&local_750);
            uVar20 = local_750.field_2._M_allocated_capacity;
            _Var21._M_p = local_750._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_750._M_dataplus._M_p != &local_750.field_2) goto LAB_00176469;
          }
          else {
            if (BVar2 != BASE_TYPE_STRUCT) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                            ,0x687,
                            "void flatbuffers::cpp::CppGenerator::GenUnionPost(const EnumDef &)");
            }
            pSVar5 = ((Type *)&pIVar4->cpp_object_api_string_type)->struct_def;
            if (pSVar5->fixed == true) {
              local_a30._M_dataplus._M_p = (pointer)&local_a30.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_a30,"");
              BaseGenerator::WrapInNameSpace
                        (&local_a70,&local_a50->super_BaseGenerator,&pSVar5->super_Definition,
                         &local_a30);
              plVar13 = (long *)std::__cxx11::string::replace
                                          ((ulong)&local_a70,0,(char *)0x0,0x36bdc8);
              local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
              psVar18 = (size_type *)(plVar13 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar13 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar18) {
                local_a90.field_2._M_allocated_capacity = *psVar18;
                local_a90.field_2._8_8_ = plVar13[3];
              }
              else {
                local_a90.field_2._M_allocated_capacity = *psVar18;
                local_a90._M_dataplus._M_p = (pointer)*plVar13;
              }
              local_a90._M_string_length = plVar13[1];
              *plVar13 = (long)psVar18;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              plVar13 = (long *)std::__cxx11::string::append((char *)&local_a90);
              local_a10._M_dataplus._M_p = (pointer)&local_a10.field_2;
              psVar18 = (size_type *)(plVar13 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar13 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar18) {
                local_a10.field_2._M_allocated_capacity = *psVar18;
                local_a10.field_2._8_8_ = plVar13[3];
              }
              else {
                local_a10.field_2._M_allocated_capacity = *psVar18;
                local_a10._M_dataplus._M_p = (pointer)*plVar13;
              }
              local_a10._M_string_length = plVar13[1];
              *plVar13 = (long)psVar18;
              plVar13[1] = 0;
              *(undefined1 *)(plVar13 + 2) = 0;
              CodeWriter::operator+=(this_00,&local_a10);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a10._M_dataplus._M_p != &local_a10.field_2) {
                operator_delete(local_a10._M_dataplus._M_p,
                                local_a10.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
                operator_delete(local_a90._M_dataplus._M_p,
                                local_a90.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
                operator_delete(local_a70._M_dataplus._M_p,
                                local_a70.field_2._M_allocated_capacity + 1);
              }
              uVar20 = local_a30.field_2._M_allocated_capacity;
              _Var21._M_p = local_a30._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a30._M_dataplus._M_p != &local_a30.field_2) {
LAB_00176469:
                operator_delete(_Var21._M_p,uVar20 + 1);
              }
            }
            else {
              local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_730,"      return ptr->UnPack(resolver);","");
              CodeWriter::operator+=(this_00,&local_730);
              uVar20 = local_730.field_2._M_allocated_capacity;
              _Var21._M_p = local_730._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_730._M_dataplus._M_p != &local_730.field_2) goto LAB_00176469;
            }
          }
          local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"    }","");
          CodeWriter::operator+=(this_00,&local_770);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_770._M_dataplus._M_p != &local_770.field_2) {
            operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
          }
        }
        ppEVar22 = ppEVar22 + 1;
      } while (ppEVar22 !=
               (local_a48->vals).vec.
               super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2d0,"    default: return nullptr;","");
    CodeWriter::operator+=(this_00,&local_2d0);
    pEVar11 = local_a48;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"  }","");
    CodeWriter::operator+=(this_00,&local_2f0);
    pCVar10 = local_a50;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"}","");
    CodeWriter::operator+=(this_00,&local_310);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
    }
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"");
    CodeWriter::operator+=(this_00,&local_330);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    UnionPackSignature_abi_cxx11_(&local_a70,pCVar10,pEVar11,false);
    plVar13 = (long *)std::__cxx11::string::replace((ulong)&local_a70,0,(char *)0x0,0x36af97);
    psVar18 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_a90.field_2._M_allocated_capacity = *psVar18;
      local_a90.field_2._8_8_ = plVar13[3];
      local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
    }
    else {
      local_a90.field_2._M_allocated_capacity = *psVar18;
      local_a90._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_a90._M_string_length = plVar13[1];
    *plVar13 = (long)psVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_a90);
    psVar18 = (size_type *)(plVar13 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_970.field_2._M_allocated_capacity = *psVar18;
      local_970.field_2._8_8_ = plVar13[3];
      local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
    }
    else {
      local_970.field_2._M_allocated_capacity = *psVar18;
      local_970._M_dataplus._M_p = (pointer)*plVar13;
    }
    local_970._M_string_length = plVar13[1];
    *plVar13 = (long)psVar18;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    CodeWriter::operator+=(this_00,&local_970);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_970._M_dataplus._M_p != &local_970.field_2) {
      operator_delete(local_970._M_dataplus._M_p,local_970.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
      operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
      operator_delete(local_a70._M_dataplus._M_p,local_a70.field_2._M_allocated_capacity + 1);
    }
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"  (void)_rehasher;","");
    CodeWriter::operator+=(this_00,&local_350);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"  switch (type) {","");
    CodeWriter::operator+=(this_00,&local_370);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    ppEVar22 = (pEVar11->vals).vec.
               super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppEVar22 !=
        (pEVar11->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      paVar16 = &local_3d0.field_2;
      paVar14 = &local_3b0.field_2;
      paVar1 = &local_390.field_2;
      do {
        local_a40 = (IDLOptions *)*ppEVar22;
        if ((local_a40->object_prefix).field_2._M_allocated_capacity != 0) {
          local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a90,"LABEL","");
          GetEnumValUse_abi_cxx11_(&local_a70,local_a50,local_a48,(EnumVal *)local_a40);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&this_00->value_map_,&local_a90);
          std::__cxx11::string::_M_assign((string *)pmVar12);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
            operator_delete(local_a70._M_dataplus._M_p,local_a70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
            operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
          }
          local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a90,"TYPE","");
          GetUnionElement_abi_cxx11_(&local_a70,local_a50,(EnumVal *)local_a40,true,local_a38);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&this_00->value_map_,&local_a90);
          std::__cxx11::string::_M_assign((string *)pmVar12);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
            operator_delete(local_a70._M_dataplus._M_p,local_a70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
            operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
          }
          local_990._M_dataplus._M_p = (pointer)&local_990.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_990,"    case {{LABEL}}: {","");
          CodeWriter::operator+=(this_00,&local_990);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_990._M_dataplus._M_p != &local_990.field_2) {
            operator_delete(local_990._M_dataplus._M_p,local_990.field_2._M_allocated_capacity + 1);
          }
          local_790._M_dataplus._M_p = (pointer)&local_790.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_790,
                     "      auto ptr = reinterpret_cast<const {{TYPE}} *>(value);","");
          CodeWriter::operator+=(this_00,&local_790);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_790._M_dataplus._M_p != &local_790.field_2) {
            operator_delete(local_790._M_dataplus._M_p,local_790.field_2._M_allocated_capacity + 1);
          }
          BVar2 = ((Type *)&local_a40->cpp_object_api_string_type)->base_type;
          if (BVar2 == BASE_TYPE_STRING) {
            local_3d0._M_dataplus._M_p = (pointer)paVar16;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_3d0,"      return _fbb.CreateString(*ptr).Union();","");
            CodeWriter::operator+=(this_00,&local_3d0);
            paVar15 = paVar16;
            _Var21._M_p = local_3d0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d0._M_dataplus._M_p != paVar16) goto LAB_00176ace;
          }
          else {
            if (BVar2 != BASE_TYPE_STRUCT) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                            ,0x6a7,
                            "void flatbuffers::cpp::CppGenerator::GenUnionPost(const EnumDef &)");
            }
            if (((Type *)&local_a40->cpp_object_api_string_type)->struct_def->fixed == true) {
              local_390._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_390,"      return _fbb.CreateStruct(*ptr).Union();","");
              CodeWriter::operator+=(this_00,&local_390);
              paVar15 = paVar1;
              _Var21._M_p = local_390._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_390._M_dataplus._M_p != paVar1) {
LAB_00176ace:
                operator_delete(_Var21._M_p,paVar15->_M_allocated_capacity + 1);
              }
            }
            else {
              local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_a90,"NAME","");
              pmVar12 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&this_00->value_map_,&local_a90);
              std::__cxx11::string::_M_assign((string *)pmVar12);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
                operator_delete(local_a90._M_dataplus._M_p,
                                local_a90.field_2._M_allocated_capacity + 1);
              }
              local_3b0._M_dataplus._M_p = (pointer)paVar14;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_3b0,
                         "      return Create{{NAME}}(_fbb, ptr, _rehasher).Union();","");
              CodeWriter::operator+=(this_00,&local_3b0);
              paVar15 = paVar14;
              _Var21._M_p = local_3b0._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b0._M_dataplus._M_p != paVar14) goto LAB_00176ace;
            }
          }
          local_7b0._M_dataplus._M_p = (pointer)&local_7b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_7b0,"    }","");
          CodeWriter::operator+=(this_00,&local_7b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7b0._M_dataplus._M_p != &local_7b0.field_2) {
            operator_delete(local_7b0._M_dataplus._M_p,local_7b0.field_2._M_allocated_capacity + 1);
          }
        }
        ppEVar22 = ppEVar22 + 1;
      } while (ppEVar22 !=
               (local_a48->vals).vec.
               super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_3f0,"    default: return 0;","");
    CodeWriter::operator+=(this_00,&local_3f0);
    pEVar11 = local_a48;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
    }
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"  }","");
    CodeWriter::operator+=(this_00,&local_410);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"}","");
    CodeWriter::operator+=(this_00,&local_430);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
    }
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
    CodeWriter::operator+=(this_00,&local_450);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
    }
    local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_470,
               "inline {{ENUM_NAME}}Union::{{ENUM_NAME}}Union(const {{ENUM_NAME}}Union &u) : type(u.type), value(nullptr) {"
               ,"");
    CodeWriter::operator+=(this_00,&local_470);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
    }
    local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"  switch (type) {","");
    CodeWriter::operator+=(this_00,&local_490);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_dataplus._M_p != &local_490.field_2) {
      operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
    }
    ppEVar22 = (pEVar11->vals).vec.
               super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    local_a40 = (IDLOptions *)
                (pEVar11->vals).vec.
                super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    if ((IDLOptions *)ppEVar22 != local_a40) {
      do {
        if ((*ppEVar22)->value != 0) {
          local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a90,"LABEL","");
          GetEnumValUse_abi_cxx11_(&local_a70,local_a50,local_a48,*ppEVar22);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&this_00->value_map_,&local_a90);
          std::__cxx11::string::_M_assign((string *)pmVar12);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
            operator_delete(local_a70._M_dataplus._M_p,local_a70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
            operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
          }
          local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a90,"TYPE","");
          GetUnionElement_abi_cxx11_(&local_a70,local_a50,*ppEVar22,true,local_a38);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&this_00->value_map_,&local_a90);
          std::__cxx11::string::_M_assign((string *)pmVar12);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
            operator_delete(local_a70._M_dataplus._M_p,local_a70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
            operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
          }
          local_9b0._M_dataplus._M_p = (pointer)&local_9b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_9b0,"    case {{LABEL}}: {","");
          CodeWriter::operator+=(this_00,&local_9b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_9b0._M_dataplus._M_p != &local_9b0.field_2) {
            operator_delete(local_9b0._M_dataplus._M_p,local_9b0.field_2._M_allocated_capacity + 1);
          }
          paVar16 = &local_4b0.field_2;
          if (((*(int *)&(local_a50->opts_).super_IDLOptions.field_0x30c < 1) &&
              (((*ppEVar22)->union_type).base_type == BASE_TYPE_STRUCT)) &&
             (pSVar5 = ((*ppEVar22)->union_type).struct_def, pSVar5->fixed == false)) {
            ppFVar6 = (pSVar5->fields).vec.
                      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppFVar7 = (pSVar5->fields).vec.
                      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (ppFVar6 == ppFVar7) goto LAB_00177024;
            bVar23 = true;
            do {
              ppFVar19 = ppFVar6 + 1;
              pFVar8 = *ppFVar6;
              if (((pFVar8->deprecated == false) &&
                  ((pFVar8->value).type.struct_def != (StructDef *)0x0)) &&
                 (pFVar8->native_inline != true)) {
                bVar9 = true;
                bVar23 = false;
              }
              else {
                bVar9 = false;
              }
            } while ((!bVar9) && (ppFVar6 = ppFVar19, ppFVar19 != ppFVar7));
            if (bVar23) goto LAB_00177024;
            paVar16 = &local_4d0.field_2;
            local_4d0._M_dataplus._M_p = (pointer)paVar16;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_4d0,
                       "      FLATBUFFERS_ASSERT(false);  // {{TYPE}} not copyable.","");
            CodeWriter::operator+=(this_00,&local_4d0);
            _Var21._M_p = local_4d0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4d0._M_dataplus._M_p != paVar16) goto LAB_00177066;
          }
          else {
LAB_00177024:
            local_4b0._M_dataplus._M_p = (pointer)paVar16;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_4b0,
                       "      value = new {{TYPE}}(*reinterpret_cast<{{TYPE}} *>(u.value));","");
            CodeWriter::operator+=(this_00,&local_4b0);
            _Var21._M_p = local_4b0._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4b0._M_dataplus._M_p != paVar16) {
LAB_00177066:
              operator_delete(_Var21._M_p,paVar16->_M_allocated_capacity + 1);
            }
          }
          local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d0,"      break;","");
          CodeWriter::operator+=(this_00,&local_7d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
            operator_delete(local_7d0._M_dataplus._M_p,local_7d0.field_2._M_allocated_capacity + 1);
          }
          local_7f0._M_dataplus._M_p = (pointer)&local_7f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_7f0,"    }","");
          CodeWriter::operator+=(this_00,&local_7f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7f0._M_dataplus._M_p != &local_7f0.field_2) {
            operator_delete(local_7f0._M_dataplus._M_p,local_7f0.field_2._M_allocated_capacity + 1);
          }
        }
        ppEVar22 = ppEVar22 + 1;
      } while ((IDLOptions *)ppEVar22 != local_a40);
    }
    local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"    default:","");
    CodeWriter::operator+=(this_00,&local_4f0);
    pCVar10 = local_a50;
    paVar16 = &local_a90.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
      operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
    }
    local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"      break;","");
    CodeWriter::operator+=(this_00,&local_510);
    pEVar11 = local_a48;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_510._M_dataplus._M_p != &local_510.field_2) {
      operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
    }
    local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"  }","");
    CodeWriter::operator+=(this_00,&local_530);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_530._M_dataplus._M_p != &local_530.field_2) {
      operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
    }
    local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"}","");
    CodeWriter::operator+=(this_00,&local_550);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_550._M_dataplus._M_p != &local_550.field_2) {
      operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
    }
    local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_570,"");
    CodeWriter::operator+=(this_00,&local_570);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_570._M_dataplus._M_p != &local_570.field_2) {
      operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
    }
    local_a90._M_dataplus._M_p = (pointer)paVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a90,"NONE","");
    cVar17 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>_>
                     *)&pEVar11->vals,&local_a90);
    if (((_Rb_tree_header *)cVar17._M_node ==
         &(pEVar11->vals).dict._M_t._M_impl.super__Rb_tree_header) ||
       (*(long *)(cVar17._M_node + 2) == 0)) {
      __assert_fail("enum_def.Lookup(\"NONE\")",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                    ,0x6da,"void flatbuffers::cpp::CppGenerator::GenUnionPost(const EnumDef &)");
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a90._M_dataplus._M_p != paVar16) {
      operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
    }
    local_a90._M_dataplus._M_p = (pointer)paVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a90,"NONE","");
    local_a30._M_dataplus._M_p = (pointer)&local_a30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a30,"NONE","");
    cVar17 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumVal_*>_>_>
                     *)&pEVar11->vals,&local_a30);
    GetEnumValUse_abi_cxx11_(&local_a70,pCVar10,pEVar11,*(EnumVal **)(cVar17._M_node + 2));
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this_00->value_map_,&local_a90);
    std::__cxx11::string::_M_assign((string *)pmVar12);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
      operator_delete(local_a70._M_dataplus._M_p,local_a70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a30._M_dataplus._M_p != &local_a30.field_2) {
      operator_delete(local_a30._M_dataplus._M_p,local_a30.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a90._M_dataplus._M_p != paVar16) {
      operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
    }
    local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_590,"inline void {{ENUM_NAME}}Union::Reset() {","");
    CodeWriter::operator+=(this_00,&local_590);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_590._M_dataplus._M_p != &local_590.field_2) {
      operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
    }
    local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"  switch (type) {","");
    CodeWriter::operator+=(this_00,&local_5b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
      operator_delete(local_5b0._M_dataplus._M_p,local_5b0.field_2._M_allocated_capacity + 1);
    }
    ppEVar22 = (pEVar11->vals).vec.
               super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (ppEVar22 !=
        (pEVar11->vals).vec.
        super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        pEVar3 = *ppEVar22;
        if (pEVar3->value != 0) {
          local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a90,"LABEL","");
          GetEnumValUse_abi_cxx11_(&local_a70,local_a50,local_a48,pEVar3);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&this_00->value_map_,&local_a90);
          std::__cxx11::string::_M_assign((string *)pmVar12);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
            operator_delete(local_a70._M_dataplus._M_p,local_a70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
            operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
          }
          local_a90._M_dataplus._M_p = (pointer)&local_a90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a90,"TYPE","");
          GetUnionElement_abi_cxx11_(&local_a70,local_a50,pEVar3,true,local_a38);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&this_00->value_map_,&local_a90);
          std::__cxx11::string::_M_assign((string *)pmVar12);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a70._M_dataplus._M_p != &local_a70.field_2) {
            operator_delete(local_a70._M_dataplus._M_p,local_a70.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a90._M_dataplus._M_p != &local_a90.field_2) {
            operator_delete(local_a90._M_dataplus._M_p,local_a90.field_2._M_allocated_capacity + 1);
          }
          local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_810,"    case {{LABEL}}: {","");
          CodeWriter::operator+=(this_00,&local_810);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_810._M_dataplus._M_p != &local_810.field_2) {
            operator_delete(local_810._M_dataplus._M_p,local_810.field_2._M_allocated_capacity + 1);
          }
          local_830._M_dataplus._M_p = (pointer)&local_830.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_830,"      auto ptr = reinterpret_cast<{{TYPE}} *>(value);",""
                    );
          CodeWriter::operator+=(this_00,&local_830);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_830._M_dataplus._M_p != &local_830.field_2) {
            operator_delete(local_830._M_dataplus._M_p,local_830.field_2._M_allocated_capacity + 1);
          }
          local_850._M_dataplus._M_p = (pointer)&local_850.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_850,"      delete ptr;","");
          CodeWriter::operator+=(this_00,&local_850);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_850._M_dataplus._M_p != &local_850.field_2) {
            operator_delete(local_850._M_dataplus._M_p,local_850.field_2._M_allocated_capacity + 1);
          }
          local_870._M_dataplus._M_p = (pointer)&local_870.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_870,"      break;","");
          CodeWriter::operator+=(this_00,&local_870);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_870._M_dataplus._M_p != &local_870.field_2) {
            operator_delete(local_870._M_dataplus._M_p,local_870.field_2._M_allocated_capacity + 1);
          }
          local_890._M_dataplus._M_p = (pointer)&local_890.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_890,"    }","");
          CodeWriter::operator+=(this_00,&local_890);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_890._M_dataplus._M_p != &local_890.field_2) {
            operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
          }
        }
        ppEVar22 = ppEVar22 + 1;
      } while (ppEVar22 !=
               (local_a48->vals).vec.
               super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d0,"    default: break;","");
    CodeWriter::operator+=(this_00,&local_5d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
      operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
    }
    local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f0,"  }","");
    CodeWriter::operator+=(this_00,&local_5f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
      operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
    }
    local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_610,"  value = nullptr;","");
    CodeWriter::operator+=(this_00,&local_610);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610._M_dataplus._M_p != &local_610.field_2) {
      operator_delete(local_610._M_dataplus._M_p,local_610.field_2._M_allocated_capacity + 1);
    }
    local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,"  type = {{NONE}};","");
    CodeWriter::operator+=(this_00,&local_630);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_630._M_dataplus._M_p != &local_630.field_2) {
      operator_delete(local_630._M_dataplus._M_p,local_630.field_2._M_allocated_capacity + 1);
    }
    local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_650,"}","");
    CodeWriter::operator+=(this_00,&local_650);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_650._M_dataplus._M_p != &local_650.field_2) {
      operator_delete(local_650._M_dataplus._M_p,local_650.field_2._M_allocated_capacity + 1);
    }
    local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"");
    CodeWriter::operator+=(this_00,&local_670);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_670._M_dataplus._M_p != &local_670.field_2) {
      operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void GenUnionPost(const EnumDef &enum_def) {
    // Generate a verifier function for this union that can be called by the
    // table verifier functions. It uses a switch case to select a specific
    // verifier function to call, this should be safe even if the union type
    // has been corrupted, since the verifiers will simply fail when called
    // on the wrong type.
    code_.SetValue("ENUM_NAME", Name(enum_def));

    code_ += "inline " + UnionVerifySignature(enum_def) + " {";
    code_ += "  switch (type) {";
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      const auto &ev = **it;
      code_.SetValue("LABEL", GetEnumValUse(enum_def, ev));

      if (ev.IsNonZero()) {
        code_.SetValue("TYPE", GetUnionElement(ev, false, opts_));
        code_ += "    case {{LABEL}}: {";
        auto getptr =
            "      auto ptr = reinterpret_cast<const {{TYPE}} *>(obj);";
        if (ev.union_type.base_type == BASE_TYPE_STRUCT) {
          if (ev.union_type.struct_def->fixed) {
            code_.SetValue("ALIGN",
                           NumToString(ev.union_type.struct_def->minalign));
            code_ +=
                "      return verifier.VerifyField<{{TYPE}}>("
                "static_cast<const uint8_t *>(obj), 0, {{ALIGN}});";
          } else {
            code_ += getptr;
            code_ += "      return verifier.VerifyTable(ptr);";
          }
        } else if (IsString(ev.union_type)) {
          code_ += getptr;
          code_ += "      return verifier.VerifyString(ptr);";
        } else {
          FLATBUFFERS_ASSERT(false);
        }
        code_ += "    }";
      } else {
        code_ += "    case {{LABEL}}: {";
        code_ += "      return true;";  // "NONE" enum value.
        code_ += "    }";
      }
    }
    code_ += "    default: return true;";  // unknown values are OK.
    code_ += "  }";
    code_ += "}";
    code_ += "";

    code_ += "inline " + UnionVectorVerifySignature(enum_def) + " {";
    code_ += "  if (!values || !types) return !values && !types;";
    code_ += "  if (values->size() != types->size()) return false;";
    code_ +=
        "  for (::flatbuffers::uoffset_t i = 0; i < values->size(); ++i) {";
    code_ += "    if (!Verify" + Name(enum_def) + "(";
    code_ += "        verifier,  values->Get(i), types->GetEnum<" +
             Name(enum_def) + ">(i))) {";
    code_ += "      return false;";
    code_ += "    }";
    code_ += "  }";
    code_ += "  return true;";
    code_ += "}";
    code_ += "";

    if (opts_.generate_object_based_api) {
      // Generate union Unpack() and Pack() functions.
      code_ += "inline " + UnionUnPackSignature(enum_def, false) + " {";
      code_ += "  (void)resolver;";
      code_ += "  switch (type) {";
      for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end();
           ++it) {
        const auto &ev = **it;
        if (ev.IsZero()) { continue; }

        code_.SetValue("LABEL", GetEnumValUse(enum_def, ev));
        code_.SetValue("TYPE", GetUnionElement(ev, false, opts_));
        code_ += "    case {{LABEL}}: {";
        code_ += "      auto ptr = reinterpret_cast<const {{TYPE}} *>(obj);";
        if (ev.union_type.base_type == BASE_TYPE_STRUCT) {
          if (ev.union_type.struct_def->fixed) {
            code_ += "      return new " +
                     WrapInNameSpace(*ev.union_type.struct_def) + "(*ptr);";
          } else {
            code_ += "      return ptr->UnPack(resolver);";
          }
        } else if (IsString(ev.union_type)) {
          code_ += "      return new std::string(ptr->c_str(), ptr->size());";
        } else {
          FLATBUFFERS_ASSERT(false);
        }
        code_ += "    }";
      }
      code_ += "    default: return nullptr;";
      code_ += "  }";
      code_ += "}";
      code_ += "";

      code_ += "inline " + UnionPackSignature(enum_def, false) + " {";
      code_ += "  (void)_rehasher;";
      code_ += "  switch (type) {";
      for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end();
           ++it) {
        auto &ev = **it;
        if (ev.IsZero()) { continue; }

        code_.SetValue("LABEL", GetEnumValUse(enum_def, ev));
        code_.SetValue("TYPE", GetUnionElement(ev, true, opts_));
        code_ += "    case {{LABEL}}: {";
        code_ += "      auto ptr = reinterpret_cast<const {{TYPE}} *>(value);";
        if (ev.union_type.base_type == BASE_TYPE_STRUCT) {
          if (ev.union_type.struct_def->fixed) {
            code_ += "      return _fbb.CreateStruct(*ptr).Union();";
          } else {
            code_.SetValue("NAME", ev.union_type.struct_def->name);
            code_ +=
                "      return Create{{NAME}}(_fbb, ptr, _rehasher).Union();";
          }
        } else if (IsString(ev.union_type)) {
          code_ += "      return _fbb.CreateString(*ptr).Union();";
        } else {
          FLATBUFFERS_ASSERT(false);
        }
        code_ += "    }";
      }
      code_ += "    default: return 0;";
      code_ += "  }";
      code_ += "}";
      code_ += "";

      // Union copy constructor
      code_ +=
          "inline {{ENUM_NAME}}Union::{{ENUM_NAME}}Union(const "
          "{{ENUM_NAME}}Union &u) : type(u.type), value(nullptr) {";
      code_ += "  switch (type) {";
      for (const auto &ev : enum_def.Vals()) {
        if (ev->IsZero()) { continue; }
        code_.SetValue("LABEL", GetEnumValUse(enum_def, *ev));
        code_.SetValue("TYPE", GetUnionElement(*ev, true, opts_));
        code_ += "    case {{LABEL}}: {";
        bool copyable = true;
        if (opts_.g_cpp_std < cpp::CPP_STD_11 &&
            ev->union_type.base_type == BASE_TYPE_STRUCT &&
            !ev->union_type.struct_def->fixed) {
          // Don't generate code to copy if table is not copyable.
          // TODO(wvo): make tables copyable instead.
          for (const auto &field : ev->union_type.struct_def->fields.vec) {
            if (!field->deprecated && field->value.type.struct_def &&
                !field->native_inline) {
              copyable = false;
              break;
            }
          }
        }
        if (copyable) {
          code_ +=
              "      value = new {{TYPE}}(*reinterpret_cast<{{TYPE}} *>"
              "(u.value));";
        } else {
          code_ +=
              "      FLATBUFFERS_ASSERT(false);  // {{TYPE}} not copyable.";
        }
        code_ += "      break;";
        code_ += "    }";
      }
      code_ += "    default:";
      code_ += "      break;";
      code_ += "  }";
      code_ += "}";
      code_ += "";

      // Union Reset() function.
      FLATBUFFERS_ASSERT(enum_def.Lookup("NONE"));
      code_.SetValue("NONE", GetEnumValUse(enum_def, *enum_def.Lookup("NONE")));

      code_ += "inline void {{ENUM_NAME}}Union::Reset() {";
      code_ += "  switch (type) {";
      for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end();
           ++it) {
        const auto &ev = **it;
        if (ev.IsZero()) { continue; }
        code_.SetValue("LABEL", GetEnumValUse(enum_def, ev));
        code_.SetValue("TYPE", GetUnionElement(ev, true, opts_));
        code_ += "    case {{LABEL}}: {";
        code_ += "      auto ptr = reinterpret_cast<{{TYPE}} *>(value);";
        code_ += "      delete ptr;";
        code_ += "      break;";
        code_ += "    }";
      }
      code_ += "    default: break;";
      code_ += "  }";
      code_ += "  value = nullptr;";
      code_ += "  type = {{NONE}};";
      code_ += "}";
      code_ += "";
    }
  }